

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void anon_unknown.dwarf_1a8469::setInputFrameBuffer
               (FrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int> *uData,
               Array2D<float> *fData,Array2D<half> *hData,int width,int height)

{
  bool ytc;
  bool ytc_00;
  bool ytc_01;
  char *name;
  undefined1 in_R10B;
  Slice local_58;
  
  if (pixelType == 2) {
    Imf_2_5::Array2D<half>::resizeErase(hData,(long)height,(long)width);
    Imf_2_5::Slice::Slice
              (&local_58,HALF,(char *)hData->_data,2,(long)width * 2,1,1,0.0,(bool)in_R10B,ytc_01);
    name = "HALF";
  }
  else if (pixelType == 1) {
    Imf_2_5::Array2D<float>::resizeErase(fData,(long)height,(long)width);
    Imf_2_5::Slice::Slice
              (&local_58,FLOAT,(char *)fData->_data,4,(long)width << 2,1,1,0.0,(bool)in_R10B,ytc_00)
    ;
    name = "FLOAT";
  }
  else {
    if (pixelType != 0) {
      return;
    }
    Imf_2_5::Array2D<unsigned_int>::resizeErase(uData,(long)height,(long)width);
    Imf_2_5::Slice::Slice
              (&local_58,UINT,(char *)uData->_data,4,(long)width << 2,1,1,0.0,(bool)in_R10B,ytc);
    name = "UINT";
  }
  Imf_2_5::FrameBuffer::insert(frameBuffer,name,&local_58);
  return;
}

Assistant:

void
setInputFrameBuffer (FrameBuffer& frameBuffer,
                     int pixelType,
                     Array2D<unsigned int>& uData,
                     Array2D<float>& fData,
                     Array2D<half>& hData,
                     int width, int height)
{
    switch (pixelType)
    {
        case 0:
            uData.resizeErase(height, width);
            frameBuffer.insert ("UINT",
                                Slice (IMF::UINT,
                                (char *) (&uData[0][0]),
                                sizeof (uData[0][0]) * 1,
                                sizeof (uData[0][0]) * width,
                                1, 1,
                                0));
            break;
        case 1:
            fData.resizeErase(height, width);
            frameBuffer.insert ("FLOAT",
                                Slice (IMF::FLOAT,
                                (char *) (&fData[0][0]),
                                sizeof (fData[0][0]) * 1,
                                sizeof (fData[0][0]) * width,
                                1, 1,
                                0));
            break;
        case 2:
            hData.resizeErase(height, width);
            frameBuffer.insert ("HALF",
                                Slice (IMF::HALF,
                                (char *) (&hData[0][0]),
                                sizeof (hData[0][0]) * 1,
                                sizeof (hData[0][0]) * width,
                                1, 1,
                                0));
            break;
    }
}